

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_hdr_copy(lws *wsi,char *dst,int len,lws_token_indexes h)

{
  uint8_t uVar1;
  ushort uVar2;
  allocated_headers *paVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  
  paVar3 = (wsi->http).ah;
  if (paVar3 != (allocated_headers *)0x0) {
    bVar4 = paVar3->frag_index[h];
    if (bVar4 != 0) {
      iVar5 = 0;
      do {
        uVar8 = (uint)paVar3->frags[bVar4].len + iVar5;
        bVar4 = paVar3->frags[bVar4].nfrag;
        iVar5 = (bVar4 != 0 && h != WSI_TOKEN_HTTP_COOKIE) + uVar8;
      } while (bVar4 != 0);
      *dst = '\0';
      if (uVar8 == 0) {
        return 0;
      }
      if (((int)uVar8 < len) && (paVar3 = (wsi->http).ah, paVar3 != (allocated_headers *)0x0)) {
        bVar4 = paVar3->frag_index[h];
        uVar7 = (ulong)bVar4;
        if (h == WSI_TOKEN_HTTP_URI_ARGS) {
          _lws_log(1,"%s: WSI_TOKEN_HTTP_URI_ARGS start frag %d\n","lws_hdr_copy",uVar7);
        }
        if (bVar4 == 0) {
          return 0;
        }
        while( true ) {
          paVar3 = (wsi->http).ah;
          uVar1 = paVar3->frags[uVar7].nfrag;
          if (h == WSI_TOKEN_HTTP_URI_ARGS) {
            _lws_log(4,"%s: WSI_TOKEN_HTTP_URI_ARGS \'%.*s\'\n","lws_hdr_copy",
                     (ulong)paVar3->frags[uVar7].len,paVar3->data + paVar3->frags[uVar7].offset);
            paVar3 = (wsi->http).ah;
          }
          uVar2 = paVar3->frags[uVar7].len;
          if (len <= (int)((uint)(uVar1 != '\0') + (uint)uVar2)) break;
          strncpy(dst,paVar3->data + paVar3->frags[uVar7].offset,(ulong)uVar2);
          paVar3 = (wsi->http).ah;
          uVar2 = paVar3->frags[uVar7].len;
          pcVar6 = dst + uVar2;
          len = len - (uint)uVar2;
          bVar4 = paVar3->frags[uVar7].nfrag;
          uVar7 = (ulong)bVar4;
          dst = pcVar6;
          if (uVar1 == '\0') {
LAB_0011c7e0:
            if (bVar4 == 0) {
              *dst = '\0';
              if (h != WSI_TOKEN_HTTP_URI_ARGS) {
                return uVar8;
              }
LAB_0011c85f:
              _lws_log(1,"%s: WSI_TOKEN_HTTP_URI_ARGS toklen %d\n","lws_hdr_copy",(ulong)uVar8);
              return uVar8;
            }
          }
          else {
            if ((h == WSI_TOKEN_HTTP_SET_COOKIE) || (h == WSI_TOKEN_HTTP_COOKIE)) {
              *pcVar6 = ';';
              dst = pcVar6 + 1;
              goto LAB_0011c7e0;
            }
            dst = pcVar6 + 1;
            if (h == WSI_TOKEN_HTTP_URI_ARGS) {
              *pcVar6 = '&';
              if (bVar4 == 0) {
                *dst = '\0';
                goto LAB_0011c85f;
              }
            }
            else {
              *pcVar6 = ',';
              if (bVar4 == 0) {
                *dst = '\0';
                return uVar8;
              }
            }
          }
        }
        _lws_log(4,"blowout len\n");
      }
      return -1;
    }
  }
  *dst = '\0';
  return 0;
}

Assistant:

int lws_hdr_copy(struct lws *wsi, char *dst, int len,
			     enum lws_token_indexes h)
{
	int toklen = lws_hdr_total_length(wsi, h);
	int n;
	int comma;

	*dst = '\0';
	if (!toklen)
		return 0;

	if (toklen >= len)
		return -1;

	if (!wsi->http.ah)
		return -1;

	n = wsi->http.ah->frag_index[h];
	if (h == WSI_TOKEN_HTTP_URI_ARGS)
		lwsl_err("%s: WSI_TOKEN_HTTP_URI_ARGS start frag %d\n", __func__, n);


	if (!n)
		return 0;
	do {
		comma = (wsi->http.ah->frags[n].nfrag) ? 1 : 0;

		if (h == WSI_TOKEN_HTTP_URI_ARGS)
			lwsl_notice("%s: WSI_TOKEN_HTTP_URI_ARGS '%.*s'\n", __func__, (int)wsi->http.ah->frags[n].len, &wsi->http.ah->data[wsi->http.ah->frags[n].offset]);

		if (wsi->http.ah->frags[n].len + comma >= len) {
			lwsl_notice("blowout len\n");
			return -1;
		}
		strncpy(dst, &wsi->http.ah->data[wsi->http.ah->frags[n].offset],
		        wsi->http.ah->frags[n].len);
		dst += wsi->http.ah->frags[n].len;
		len -= wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (comma) {
			if (h == WSI_TOKEN_HTTP_COOKIE || h == WSI_TOKEN_HTTP_SET_COOKIE)
				*dst++ = ';';
			else
				if (h == WSI_TOKEN_HTTP_URI_ARGS)
					*dst++ = '&';
				else
					*dst++ = ',';
		}
				
	} while (n);
	*dst = '\0';

	if (h == WSI_TOKEN_HTTP_URI_ARGS)
		lwsl_err("%s: WSI_TOKEN_HTTP_URI_ARGS toklen %d\n", __func__, (int)toklen);

	return toklen;
}